

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status
fdb_get_nearest(fdb_kvs_handle *handle,void *key,size_t keylen,fdb_doc *doc,
               fdb_get_nearest_opt_t opt)

{
  atomic<unsigned_long> *paVar1;
  ushort uVar2;
  fdb_kvs_id_t fVar3;
  docio_handle *pdVar4;
  hbtrie *trie;
  btreeblk_handle *pbVar5;
  fdb_custom_cmp_variable p_Var6;
  long lVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [14];
  void *pvVar13;
  size_t offset_00;
  uint64_t uVar14;
  hbtrie_result hVar15;
  int iVar16;
  int iVar17;
  void *pvVar18;
  int64_t iVar19;
  ulong uVar20;
  undefined1 *buf;
  fdb_status fVar21;
  void *pvVar22;
  long in_FS_OFFSET;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined8 uStack_140;
  undefined1 auStack_138 [8];
  undefined1 local_130 [8];
  hbtrie_iterator hit;
  fdb_kvs_id_t kv_id;
  undefined1 auStack_88 [8];
  docio_object _doc;
  void *local_48;
  size_t ret_keylen;
  uint64_t offset;
  
  buf = auStack_138;
  auStack_88._0_2_ = 0;
  auStack_88._2_2_ = 0;
  auStack_88._4_4_ = 0;
  _doc.length.keylen = 0;
  _doc.length.metalen = 0;
  _doc.length.bodylen = 0;
  _doc.length.bodylen_ondisk = 0;
  _doc.timestamp = 0;
  _doc._20_4_ = 0;
  _doc.key = (void *)0x0;
  _doc.field_3.seqnum = 0;
  _doc.meta = (void *)0x0;
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar21 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar21 = FDB_RESULT_INVALID_CONFIG;
    if (((((handle->config).do_not_search_wal == true) &&
         (fVar21 = FDB_RESULT_INVALID_ARGS, 0xffffffffffff007f < keylen - 0xff81)) &&
        (key != (void *)0x0)) &&
       ((doc != (fdb_doc *)0x0 &&
        (((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0 ||
         (keylen <= (handle->config).blocksize - 0x100)))))) {
      LOCK();
      bVar23 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
      if (bVar23) {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
      }
      UNLOCK();
      fVar21 = FDB_RESULT_HANDLE_BUSY;
      if (bVar23) {
        if (handle->kvs != (kvs_info *)0x0) {
          uVar20 = (ulong)(handle->config).chunksize;
          _doc.body = (void *)(uVar20 + keylen);
          lVar7 = -(uVar20 + keylen + 0xf & 0xfffffffffffffff0);
          buf = auStack_138 + lVar7;
          fVar3 = handle->kvs->id;
          offset = (uint64_t)key;
          *(undefined8 *)((long)&uStack_140 + lVar7) = 0x1343fd;
          kvid2buf(uVar20,fVar3,buf);
          uVar14 = offset;
          *(undefined8 *)((long)&uStack_140 + lVar7) = 0x13440f;
          memcpy(buf + uVar20,(void *)uVar14,keylen);
          keylen = (size_t)_doc.body;
          key = buf;
        }
        if (handle->shandle == (snap_handle *)0x0) {
          *(undefined8 *)(buf + -8) = 0x134427;
          fdb_check_file_reopen(handle,(file_status_t *)0x0);
        }
        pdVar4 = handle->dhandle;
        if (handle->shandle == (snap_handle *)0x0) {
          *(undefined8 *)(buf + -8) = 0x13443d;
          fdb_sync_db_header(handle);
        }
        LOCK();
        paVar1 = &handle->op_stats->num_gets;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        *(undefined8 *)(buf + -8) = 0x13444e;
        _fdb_sync_dirty_root(handle);
        if (*(char *)(in_FS_OFFSET + -0x78) == '\0') {
          *(undefined8 *)(buf + -8) = 0x1347d1;
          fdb_get_nearest_cold_1();
        }
        local_48 = (void *)0x0;
        trie = handle->trie;
        *(undefined8 *)(buf + -8) = 0x13447b;
        hVar15 = hbtrie_iterator_init(trie,(hbtrie_iterator *)local_130,key,keylen);
        if (hVar15 == HBTRIE_RESULT_SUCCESS) {
          _doc.body = pdVar4;
          offset = (uint64_t)key;
          if (opt < 2) {
            do {
              pvVar22 = *(void **)(in_FS_OFFSET + -0x90);
              *(undefined8 *)(buf + -8) = 0x1344e5;
              hVar15 = hbtrie_next((hbtrie_iterator *)local_130,pvVar22,(size_t *)&local_48,
                                   &ret_keylen);
              uVar14 = offset;
              pvVar13 = local_48;
              p_Var6 = (handle->kvs_config).custom_cmp;
              pvVar22 = *(void **)(in_FS_OFFSET + -0x90);
              if (p_Var6 == (fdb_custom_cmp_variable)0x0) {
                if ((void *)keylen == local_48) {
                  *(undefined8 *)(buf + -8) = 0x134524;
                  iVar16 = memcmp((void *)uVar14,pvVar22,keylen);
                }
                else {
                  pvVar18 = local_48;
                  if (keylen < local_48) {
                    pvVar18 = (void *)keylen;
                  }
                  *(undefined8 *)(buf + -8) = 0x13453c;
                  iVar17 = memcmp((void *)uVar14,pvVar22,(size_t)pvVar18);
                  iVar16 = (int)keylen - (int)pvVar13;
                  if (iVar17 != 0) {
                    iVar16 = iVar17;
                  }
                }
              }
              else {
                pvVar18 = (handle->kvs_config).custom_cmp_param;
                *(undefined8 *)(buf + -8) = 0x13450e;
                iVar16 = (*p_Var6)((void *)uVar14,keylen,pvVar22,(size_t)pvVar13,pvVar18);
              }
            } while (((0 < iVar16 || opt != '\0') && (opt != '\x01' || -1 < iVar16)) &&
                    (hVar15 == HBTRIE_RESULT_SUCCESS));
          }
          else {
            do {
              pvVar22 = *(void **)(in_FS_OFFSET + -0x90);
              *(undefined8 *)(buf + -8) = 0x13459f;
              hVar15 = hbtrie_prev((hbtrie_iterator *)local_130,pvVar22,(size_t *)&local_48,
                                   &ret_keylen);
              uVar14 = offset;
              pvVar13 = local_48;
              p_Var6 = (handle->kvs_config).custom_cmp;
              pvVar22 = *(void **)(in_FS_OFFSET + -0x90);
              if (p_Var6 == (fdb_custom_cmp_variable)0x0) {
                if ((void *)keylen == local_48) {
                  *(undefined8 *)(buf + -8) = 0x1345de;
                  iVar16 = memcmp((void *)uVar14,pvVar22,keylen);
                }
                else {
                  pvVar18 = local_48;
                  if (keylen < local_48) {
                    pvVar18 = (void *)keylen;
                  }
                  *(undefined8 *)(buf + -8) = 0x1345f6;
                  iVar17 = memcmp((void *)uVar14,pvVar22,(size_t)pvVar18);
                  iVar16 = (int)keylen - (int)pvVar13;
                  if (iVar17 != 0) {
                    iVar16 = iVar17;
                  }
                }
              }
              else {
                pvVar18 = (handle->kvs_config).custom_cmp_param;
                *(undefined8 *)(buf + -8) = 0x1345c8;
                iVar16 = (*p_Var6)((void *)uVar14,keylen,pvVar22,(size_t)pvVar13,pvVar18);
              }
            } while (((iVar16 < 0 || opt != '\x02') && (opt != '\x03' || iVar16 < 1)) &&
                    (hVar15 == HBTRIE_RESULT_SUCCESS));
          }
          *(undefined8 *)(buf + -8) = 0x13463c;
          hbtrie_iterator_free((hbtrie_iterator *)local_130);
          pbVar5 = handle->bhandle;
          *(undefined8 *)(buf + -8) = 0x134645;
          btreeblk_end(pbVar5);
          ret_keylen = ret_keylen >> 0x38 | (ret_keylen & 0xff000000000000) >> 0x28 |
                       (ret_keylen & 0xff0000000000) >> 0x18 | (ret_keylen & 0xff00000000) >> 8 |
                       (ret_keylen & 0xff000000) << 8 | (ret_keylen & 0xff0000) << 0x18 |
                       (ret_keylen & 0xff00) << 0x28 | ret_keylen << 0x38;
          *(undefined8 *)(buf + -8) = 0x134658;
          _fdb_release_dirty_root(handle);
          offset_00 = ret_keylen;
          pvVar22 = _doc.body;
          if (hVar15 == HBTRIE_RESULT_SUCCESS) {
            *(undefined8 *)(buf + -8) = 0x134689;
            iVar19 = docio_read_doc((docio_handle *)pvVar22,offset_00,(docio_object *)auStack_88,
                                    true);
            uVar10 = _doc._16_8_;
            if (iVar19 < 1) {
              LOCK();
              if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              }
              UNLOCK();
              if (iVar19 == 0) {
                return FDB_RESULT_KEY_NOT_FOUND;
              }
              return (fdb_status)iVar19;
            }
            if ((_doc.length.bodylen & 4) == 0) {
              if (handle->kvs != (kvs_info *)0x0) {
                uVar2 = (handle->config).chunksize;
                *(undefined8 *)(buf + -8) = 0x1346ba;
                buf2kvid((ulong)uVar2,(void *)uVar10,(fdb_kvs_id_t *)&hit.flags);
                uVar10 = _doc._16_8_;
                fVar3 = handle->kvs->id;
                if (hit._144_8_ == fVar3) {
                  auStack_88._0_2_ = auStack_88._0_2_ - uVar2;
                  pvVar22 = (void *)((ulong)uVar2 + _doc._16_8_);
                  uVar20 = (ulong)(ushort)auStack_88._0_2_;
                  *(undefined8 *)(buf + -8) = 0x1346e6;
                  memmove((void *)uVar10,pvVar22,uVar20);
                }
                else {
                  LOCK();
                  if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                    (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                  }
                  UNLOCK();
                  *(undefined8 *)(buf + -8) = 0x134748;
                  free_docio_object((docio_object *)auStack_88,'\x01','\x01','\x01');
                }
                if (hit._144_8_ != fVar3) {
                  return FDB_RESULT_KEY_NOT_FOUND;
                }
              }
              doc->key = (void *)_doc._16_8_;
              doc->seqnum = (fdb_seqnum_t)_doc.key;
              uVar10 = CONCAT44(auStack_88._4_4_,CONCAT22(auStack_88._2_2_,auStack_88._0_2_));
              auVar11._8_2_ = _doc.length.keylen;
              auVar11._10_2_ = _doc.length.metalen;
              auVar11._0_8_ = uVar10;
              auVar8._10_2_ = 0;
              auVar8._0_10_ = auVar11._0_10_;
              auVar8._12_2_ = SUB42(auStack_88._4_4_,2);
              auVar9._8_2_ = (short)auStack_88._4_4_;
              auVar9._0_8_ = uVar10;
              auVar9._10_4_ = auVar8._10_4_;
              auVar12._6_8_ = 0;
              auVar12._0_6_ = auVar9._8_6_;
              auVar24._0_8_ = (ulong)CONCAT22(auStack_88._2_2_,auStack_88._0_2_) & 0xffff;
              auVar24._8_4_ = (int)CONCAT82(SUB148(auVar12 << 0x40,6),auStack_88._2_2_);
              auVar24._12_4_ = 0;
              doc->keylen = auVar24._0_8_;
              doc->metalen = auVar24._8_8_;
              doc->bodylen = (ulong)(uint)auStack_88._4_4_;
              doc->meta = (void *)_doc.field_3;
              doc->body = _doc.meta;
              doc->deleted = (bool)((byte)_doc.length.bodylen >> 2 & 1);
              doc->size_ondisk =
                   (ulong)((uint)(ushort)auStack_88._0_2_ + (uint)(ushort)auStack_88._2_2_ +
                          _doc.length._0_4_) + 0x20;
              doc->offset = ret_keylen;
              LOCK();
              if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              }
              UNLOCK();
              return FDB_RESULT_SUCCESS;
            }
            *(undefined8 *)(buf + -8) = 0x13471f;
            free_docio_object((docio_object *)auStack_88,'\x01','\x01','\x01');
          }
        }
        else {
          pbVar5 = handle->bhandle;
          *(undefined8 *)(buf + -8) = 0x134488;
          btreeblk_end(pbVar5);
          ret_keylen = ret_keylen >> 0x38 | (ret_keylen & 0xff000000000000) >> 0x28 |
                       (ret_keylen & 0xff0000000000) >> 0x18 | (ret_keylen & 0xff00000000) >> 8 |
                       (ret_keylen & 0xff000000) << 8 | (ret_keylen & 0xff0000) << 0x18 |
                       (ret_keylen & 0xff00) << 0x28 | ret_keylen << 0x38;
          *(undefined8 *)(buf + -8) = 0x13449b;
          _fdb_release_dirty_root(handle);
        }
        LOCK();
        if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
        }
        UNLOCK();
        fVar21 = FDB_RESULT_KEY_NOT_FOUND;
      }
    }
  }
  return fVar21;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_nearest(fdb_kvs_handle *handle,
                           const void *key,
                           size_t keylen,
                           fdb_doc *doc,
                           fdb_get_nearest_opt_t opt)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    //fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!handle->config.do_not_search_wal) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!doc || !key || keylen == 0 ||
        keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    // Need to prepend 8-byte ID in multi-KVS mode.
    void* doc_key = (void*)key;
    size_t doc_keylen = keylen;

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_keylen = keylen + size_chunk;
        doc_key = alca(uint8_t, doc_keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_key);
        memcpy((uint8_t*)doc_key + size_chunk, key, keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    dhandle = handle->dhandle;

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    _fdb_sync_dirty_root(handle);

    struct hbtrie_iterator hit;

    thread_local std::vector<char> ret_key_buf(FDB_MAX_KEYLEN_INTERNAL);
    size_t ret_keylen = 0;

    hr = hbtrie_iterator_init(handle->trie, &hit, doc_key, doc_keylen);
    if (hr == HBTRIE_RESULT_SUCCESS) {
        // NOTE: Due to HB-trie's suffix skip, may need to call prev/next
        //       multiple times.
        if (opt == FDB_GET_GREATER_OR_EQUAL || opt == FDB_GET_GREATER) {
            do {
                hr = hbtrie_next(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_GREATER_OR_EQUAL && cmp <= 0) break;
                if (opt == FDB_GET_GREATER && cmp < 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);

        } else {
            do {
                hr = hbtrie_prev(&hit, &ret_key_buf[0], &ret_keylen, (void *)&offset);
                int cmp = 0;
                if (handle->kvs_config.custom_cmp) {
                    cmp = handle->kvs_config.custom_cmp(
                              doc_key, doc_keylen,
                              &ret_key_buf[0], ret_keylen,
                              handle->kvs_config.custom_cmp_param );
                } else {
                    cmp = _lex_keycmp( doc_key, doc_keylen,
                                       &ret_key_buf[0], ret_keylen );
                }
                if (opt == FDB_GET_SMALLER_OR_EQUAL && cmp >= 0) break;
                if (opt == FDB_GET_SMALLER && cmp > 0) break;
            } while (hr == HBTRIE_RESULT_SUCCESS);
        }
        hbtrie_iterator_free(&hit);
    }
    btreeblk_end(handle->bhandle);
    offset = _endian_decode(offset);

    _fdb_release_dirty_root(handle);

    if (hr == HBTRIE_RESULT_SUCCESS) {
        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.flag & DOCIO_DELETED) {
            free_docio_object(&_doc, 1, 1, 1);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        if (handle->kvs) {
            fdb_kvs_id_t kv_id;
            size_t size_chunk = handle->config.chunksize;
            buf2kvid(size_chunk, _doc.key, &kv_id);
            if (kv_id != handle->kvs->id) {
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                free_docio_object(&_doc, 1, 1, 1);
                return FDB_RESULT_KEY_NOT_FOUND;
            }
            _doc.length.keylen -= size_chunk;
            memmove(_doc.key, (uint8_t*)_doc.key + size_chunk, _doc.length.keylen);
        }
        doc->key = _doc.key;
        doc->keylen = _doc.length.keylen;

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}